

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection1.c
# Opt level: O1

void ssh1_channel_check_close(ssh1_channel *c)

{
  uint uVar1;
  ssh1_connection_state *psVar2;
  Channel *pCVar3;
  _Bool _Var4;
  PktOut *pPVar5;
  
  if (c->halfopen != false) {
    return;
  }
  psVar2 = c->connlayer;
  uVar1 = c->closes;
  if ((((~uVar1 & 5) == 0) ||
      (_Var4 = (*c->chan->vt->want_close)
                         (c->chan,(_Bool)((byte)uVar1 & 1),SUB41((uVar1 & 4) >> 2,0)), _Var4)) &&
     ((c->closes & 2U) == 0)) {
    if ((c->closes & 1U) == 0) {
      pPVar5 = (*((psVar2->ppl).bpp)->vt->new_pktout)(0x18);
      BinarySink_put_uint32(pPVar5->binarysink_,(ulong)c->remoteid);
      pq_base_push(&((psVar2->ppl).out_pq)->pqb,&pPVar5->qnode);
      *(byte *)&c->closes = (byte)c->closes | 1;
    }
    if ((c->closes & 4) != 0) {
      pPVar5 = (*((psVar2->ppl).bpp)->vt->new_pktout)(0x19);
      BinarySink_put_uint32(pPVar5->binarysink_,(ulong)c->remoteid);
      pq_base_push(&((psVar2->ppl).out_pq)->pqb,&pPVar5->qnode);
      *(byte *)&c->closes = (byte)c->closes | 2;
    }
  }
  if ((~c->closes & 10U) != 0) {
    return;
  }
  psVar2 = c->connlayer;
  ssh1_channel_close_local(c,(char *)0x0);
  del234(psVar2->channels,c);
  pCVar3 = c->chan;
  if (pCVar3 != (Channel *)0x0) {
    (*pCVar3->vt->free)(pCVar3);
  }
  safefree(c);
  queue_toplevel_callback(ssh1_check_termination_callback,psVar2);
  return;
}

Assistant:

static void ssh1_channel_check_close(struct ssh1_channel *c)
{
    struct ssh1_connection_state *s = c->connlayer;
    PktOut *pktout;

    if (c->halfopen) {
        /*
         * If we've sent out our own CHANNEL_OPEN but not yet seen
         * either OPEN_CONFIRMATION or OPEN_FAILURE in response, then
         * it's too early to be sending close messages of any kind.
         */
        return;
    }

    if ((!((CLOSES_SENT_CLOSE | CLOSES_RCVD_CLOSE) & ~c->closes) ||
         chan_want_close(c->chan, (c->closes & CLOSES_SENT_CLOSE),
                         (c->closes & CLOSES_RCVD_CLOSE))) &&
        !(c->closes & CLOSES_SENT_CLOSECONF)) {
        /*
         * We have both sent and received CLOSE (or the channel type
         * doesn't need us to), which means the channel is in final
         * wind-up. Send CLOSE and/or CLOSE_CONFIRMATION, whichever we
         * haven't sent yet.
         */
        if (!(c->closes & CLOSES_SENT_CLOSE)) {
            pktout = ssh_bpp_new_pktout(s->ppl.bpp, SSH1_MSG_CHANNEL_CLOSE);
            put_uint32(pktout, c->remoteid);
            pq_push(s->ppl.out_pq, pktout);
            c->closes |= CLOSES_SENT_CLOSE;
        }
        if (c->closes & CLOSES_RCVD_CLOSE) {
            pktout = ssh_bpp_new_pktout(
                s->ppl.bpp, SSH1_MSG_CHANNEL_CLOSE_CONFIRMATION);
            put_uint32(pktout, c->remoteid);
            pq_push(s->ppl.out_pq, pktout);
            c->closes |= CLOSES_SENT_CLOSECONF;
        }
    }

    if (!((CLOSES_SENT_CLOSECONF | CLOSES_RCVD_CLOSECONF) & ~c->closes)) {
        /*
         * We have both sent and received CLOSE_CONFIRMATION, which
         * means we're completely done with the channel.
         */
        ssh1_channel_destroy(c);
    }
}